

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteList.c
# Opt level: O0

void Io_WriteList(Abc_Ntk_t *pNtk,char *pFileName,int fUseHost)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  int local_34;
  int i;
  Abc_Obj_t *pObj;
  FILE *pFile;
  int fUseHost_local;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Io_WriteList(): Cannot open the output file \"%s\".\n",pFileName);
  }
  else {
    fprintf(__stream,"# Adjacency list for sequential AIG \"%s\"\n",pNtk->pName);
    pcVar2 = Extra_TimeStamp();
    fprintf(__stream,"# written by ABC on %s\n",pcVar2);
    pAVar3 = Abc_AigConst1(pNtk);
    iVar1 = Abc_ObjFanoutNum(pAVar3);
    if (0 < iVar1) {
      pAVar3 = Abc_AigConst1(pNtk);
      Io_WriteListEdge((FILE *)__stream,pAVar3);
    }
    for (local_34 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar3 = Abc_NtkPi(pNtk,local_34);
      Io_WriteListEdge((FILE *)__stream,pAVar3);
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar3 = Abc_NtkObj(pNtk,local_34);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar3), iVar1 != 0)) {
        Io_WriteListEdge((FILE *)__stream,pAVar3);
      }
    }
    if (fUseHost == 0) {
      for (local_34 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
        pAVar3 = Abc_NtkPo(pNtk,local_34);
        Io_WriteListEdge((FILE *)__stream,pAVar3);
      }
    }
    else {
      Io_WriteListHost((FILE *)__stream,pNtk);
    }
    fprintf(__stream,"\n");
    fclose(__stream);
  }
  return;
}

Assistant:

void Io_WriteList( Abc_Ntk_t * pNtk, char * pFileName, int fUseHost )
{
    FILE * pFile;
    Abc_Obj_t * pObj;
    int i;

//    assert( Abc_NtkIsSeq(pNtk)  );

    // start the output stream
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteList(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    fprintf( pFile, "# Adjacency list for sequential AIG \"%s\"\n", pNtk->pName );
    fprintf( pFile, "# written by ABC on %s\n", Extra_TimeStamp() );

    // write the constant node
    if ( Abc_ObjFanoutNum( Abc_AigConst1(pNtk) ) > 0 )
        Io_WriteListEdge( pFile, Abc_AigConst1(pNtk) );

    // write the PI edges
    Abc_NtkForEachPi( pNtk, pObj, i )
        Io_WriteListEdge( pFile, pObj );

    // write the internal nodes
    Abc_AigForEachAnd( pNtk, pObj, i )
        Io_WriteListEdge( pFile, pObj );

    // write the host node
    if ( fUseHost )
        Io_WriteListHost( pFile, pNtk );
    else
        Abc_NtkForEachPo( pNtk, pObj, i )
            Io_WriteListEdge( pFile, pObj );

    fprintf( pFile, "\n" );
    fclose( pFile );
}